

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_std_getenviron(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue this_obj;
  JSValue JVar1;
  long lVar2;
  int iVar3;
  JSAtom JVar4;
  JSValueUnion JVar5;
  long lVar6;
  JSContext *in_RDI;
  JSValue JVar7;
  JSValue JVar8;
  int ret;
  JSAtom atom;
  size_t name_len;
  uint32_t idx;
  JSValue obj;
  char *value;
  char *p;
  char *name;
  char **envp;
  JSAtom in_stack_ffffffffffffff4c;
  JSContext *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  JSAtom in_stack_ffffffffffffff5c;
  JSValueUnion in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  JSValueUnion ctx_00;
  uint prop;
  char *__s;
  int in_stack_ffffffffffffffd0;
  undefined4 local_10;
  undefined4 uStack_c;
  undefined8 local_8;
  
  JVar7 = JS_NewObject((JSContext *)0x110aeb);
  ctx_00 = JVar7.u;
  local_8 = (JSValueUnion)JVar7.tag;
  iVar3 = JS_IsException(JVar7);
  lVar2 = _environ;
  if (iVar3 == 0) {
    prop = 0;
    while (*(long *)(lVar2 + (ulong)prop * 8) != 0) {
      __s = *(char **)(lVar2 + (ulong)prop * 8);
      JVar5.ptr = strchr(__s,0x3d);
      if (JVar5.ptr != (void *)0x0) {
        lVar6 = (long)JVar5.ptr + 1;
        JVar4 = JS_NewAtomLen((JSContext *)JVar7.tag,(char *)JVar7.u.ptr,in_stack_ffffffffffffff68);
        if (JVar4 != 0) {
          in_stack_ffffffffffffff50 = in_RDI;
          JVar8 = JS_NewString((JSContext *)in_stack_ffffffffffffff60.ptr,
                               (char *)CONCAT44(JVar4,in_stack_ffffffffffffff58));
          in_stack_ffffffffffffff60 = JVar8.u;
          in_stack_ffffffffffffff68 = JVar8.tag;
          this_obj.tag = (int64_t)__s;
          this_obj.u.ptr = JVar5.ptr;
          JVar8.tag = lVar6;
          JVar8.u.ptr = local_8;
          iVar3 = JS_DefinePropertyValue
                            ((JSContext *)ctx_00.ptr,this_obj,prop,JVar8,in_stack_ffffffffffffffd0);
          JS_FreeAtom(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
          in_stack_ffffffffffffff5c = JVar4;
          if (-1 < iVar3) goto LAB_00110c58;
        }
        JVar7.u._4_4_ = in_stack_ffffffffffffff5c;
        JVar7.u.int32 = in_stack_ffffffffffffff58;
        JVar7.tag = (int64_t)in_stack_ffffffffffffff60.ptr;
        JS_FreeValue(in_stack_ffffffffffffff50,JVar7);
        local_10 = 0;
        local_8 = 2.96439387504748e-323;
        goto LAB_00110cb2;
      }
LAB_00110c58:
      prop = prop + 1;
    }
    local_10 = ctx_00.int32;
    uStack_c = ctx_00._4_4_;
  }
  else {
    local_10 = 0;
    local_8 = 2.96439387504748e-323;
  }
LAB_00110cb2:
  JVar1.u._4_4_ = uStack_c;
  JVar1.u.int32 = local_10;
  JVar1.tag = (int64_t)local_8;
  return JVar1;
}

Assistant:

static JSValue js_std_getenviron(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv)
{
    char **envp;
    const char *name, *p, *value;
    JSValue obj;
    uint32_t idx;
    size_t name_len;
    JSAtom atom;
    int ret;

    obj = JS_NewObject(ctx);
    if (JS_IsException(obj))
        return JS_EXCEPTION;
    envp = environ;
    for(idx = 0; envp[idx] != NULL; idx++) {
        name = envp[idx];
        p = strchr(name, '=');
        name_len = p - name;
        if (!p)
            continue;
        value = p + 1;
        atom = JS_NewAtomLen(ctx, name, name_len);
        if (atom == JS_ATOM_NULL)
            goto fail;
        ret = JS_DefinePropertyValue(ctx, obj, atom, JS_NewString(ctx, value),
                                     JS_PROP_C_W_E);
        JS_FreeAtom(ctx, atom);
        if (ret < 0)
            goto fail;
    }
    return obj;
 fail:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}